

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void refresh_stt_win(void)

{
  _Rb_tree_node_base *__lhs;
  undefined8 uVar1;
  WINDOW *pWVar2;
  _Alloc_hider _Var3;
  int iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  long lVar7;
  int iVar8;
  Uniforms *pUVar9;
  size_t j;
  ulong uVar10;
  int iVar11;
  float fVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((stt_visible) && (uniforms != (Uniforms *)0x0)) {
    werase(stt_win);
    iVar8 = stt_y;
    if (have_colors == true) {
      wattr_on(stt_win,0x100,0);
    }
    wborder(stt_win,0x7c,0x20,0x20,0x20,0x2b,0x2b,0x2b,0x2b);
    pUVar9 = uniforms;
    for (p_Var6 = (uniforms->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pWVar2 = stt_win, iVar11 = stt_x,
        (_Rb_tree_header *)p_Var6 != &(pUVar9->functions)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      if (((char)p_Var6[5]._M_color == _S_black) && (p_Var6[3]._M_left != (_Base_ptr)0x0)) {
        uVar1 = *(undefined8 *)(p_Var6 + 1);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
        ::operator()(&local_50,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                      *)(p_Var6 + 3));
        mvwprintw(pWVar2,iVar8,iVar11,"%23s  %s",uVar1,local_50._M_dataplus._M_p);
        iVar8 = iVar8 + 1;
        std::__cxx11::string::~string((string *)&local_50);
        pUVar9 = uniforms;
      }
    }
    for (p_Var6 = (pUVar9->sequences)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pWVar2 = stt_win, iVar11 = stt_x,
        (_Rb_tree_header *)p_Var6 != &(pUVar9->sequences)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      lVar7 = (long)p_Var6[2]._M_parent - *(long *)(p_Var6 + 2);
      if (lVar7 != 0) {
        uVar1 = *(undefined8 *)(p_Var6 + 1);
        UniformData::print_abi_cxx11_
                  (&local_50,
                   (UniformData *)
                   (*(long *)(p_Var6 + 2) + (pUVar9->m_frame % (ulong)(lVar7 / 0x70)) * 0x70));
        mvwprintw(pWVar2,iVar8,iVar11,"%23s  %s",uVar1,local_50._M_dataplus._M_p);
        iVar8 = iVar8 + 1;
        std::__cxx11::string::~string((string *)&local_50);
        pUVar9 = uniforms;
      }
    }
    p_Var6 = (pUVar9->super_Scene).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pWVar2 = stt_win, iVar11 = stt_x,
          (_Rb_tree_header *)p_Var6 !=
          &(pUVar9->super_Scene).textures._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1),"Resolution");
      _Var3._M_p = local_50._M_dataplus._M_p;
      iVar4 = (**(code **)(**(long **)(p_Var6 + 2) + 0x60))();
      iVar5 = (**(code **)(**(long **)(p_Var6 + 2) + 0x68))();
      mvwprintw((double)iVar4,(double)iVar5,pWVar2,iVar8,iVar11,"%23s  %.1f,%.1f",_Var3._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      iVar8 = iVar8 + 1;
      pUVar9 = uniforms;
    }
    p_Var6 = (pUVar9->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pWVar2 = stt_win, iVar11 = stt_x,
          (_Rb_tree_header *)p_Var6 !=
          &(pUVar9->super_Scene).streams._M_t._M_impl.super__Rb_tree_header) {
      __lhs = p_Var6 + 1;
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     "CurrentFrame");
      _Var3._M_p = local_50._M_dataplus._M_p;
      fVar12 = (float)(**(code **)(**(long **)(p_Var6 + 2) + 0xe8))();
      mvwprintw((double)fVar12,pWVar2,iVar8,iVar11,"%23s  %.3f",_Var3._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      pWVar2 = stt_win;
      iVar11 = stt_x;
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     "TotalFrames");
      _Var3._M_p = local_50._M_dataplus._M_p;
      fVar12 = (float)(**(code **)(**(long **)(p_Var6 + 2) + 0xe0))();
      mvwprintw((double)fVar12,pWVar2,iVar8 + 1,iVar11,"%23s  %.3f",_Var3._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      pWVar2 = stt_win;
      iVar11 = stt_x;
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     "Time");
      _Var3._M_p = local_50._M_dataplus._M_p;
      fVar12 = (float)(**(code **)(**(long **)(p_Var6 + 2) + 0xd0))();
      mvwprintw((double)fVar12,pWVar2,iVar8 + 2,iVar11,"%23s  %.3f",_Var3._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      pWVar2 = stt_win;
      iVar11 = stt_x;
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     "Duration");
      _Var3._M_p = local_50._M_dataplus._M_p;
      fVar12 = (float)(**(code **)(**(long **)(p_Var6 + 2) + 200))();
      mvwprintw((double)fVar12,pWVar2,iVar8 + 3,iVar11,"%23s  %.3f",_Var3._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      pWVar2 = stt_win;
      iVar11 = stt_x;
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     "Fps");
      _Var3._M_p = local_50._M_dataplus._M_p;
      fVar12 = (float)(**(code **)(**(long **)(p_Var6 + 2) + 0xc0))();
      mvwprintw((double)fVar12,pWVar2,iVar8 + 4,iVar11,"%23s  %.3f",_Var3._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      iVar8 = iVar8 + 5;
      pUVar9 = uniforms;
    }
    if (have_colors != false) {
      wattr_off(stt_win,0x100,0);
    }
    if ((have_colors & 1U) != 0) {
      wattr_on(stt_win,0x200,0);
    }
    iVar11 = 0;
    pUVar9 = uniforms;
    uniforms_starts_at = iVar8;
    for (p_Var6 = (uniforms->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(pUVar9->data)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      if (*(ulong *)(p_Var6 + 5) < 5) {
        mvwprintw(stt_win,iVar8,stt_x,"%23s",*(undefined8 *)(p_Var6 + 1));
        iVar4 = (int)((ulong)((long)stt_width - (long)stt_values_col) / *(ulong *)(p_Var6 + 5)) +
                stt_x;
        if (iVar11 == mouse_at) {
          std::__cxx11::string::assign((char *)&mouse_at_key_abi_cxx11_);
          mouse_at_index = 0;
          if (stt_values_col + iVar4 < mouse_x) {
            mouse_at_index = (size_t)((mouse_x - stt_values_col) / iVar4);
          }
        }
        for (uVar10 = 0; (uVar10 < 4 && (uVar10 < *(ulong *)(p_Var6 + 5))); uVar10 = uVar10 + 1) {
          if (((iVar11 == mouse_at) && (uVar10 == mouse_at_index)) && (have_colors == true)) {
            wattr_on(stt_win,0x200,0);
          }
          mvwprintw((double)*(float *)((long)&p_Var6[4]._M_left + uVar10 * 4),stt_win,iVar8,
                    iVar4 * (int)uVar10 + stt_values_col,"%.3f");
          if (have_colors == true) {
            wattr_off(stt_win,0x200,0);
          }
        }
        iVar8 = iVar8 + 1;
        iVar11 = iVar11 + 1;
        pUVar9 = uniforms;
      }
    }
    if (have_colors != false) {
      wattr_on(stt_win,0x200,0);
    }
    wrefresh(stt_win);
    refresh_cursor();
  }
  return;
}

Assistant:

void refresh_stt_win() {
    if (!stt_visible || uniforms == nullptr)
        return;

    werase(stt_win);

    size_t y = stt_y;

    if (have_colors) wattron(stt_win, COLOR_PAIR(1));
    wborder(stt_win, '|', ' ', ' ', ' ', '+', '+', '+', '+');
    // box(stt_win, 0, 0);
    // Print Native Uniforms (they carry functions) that are present on the shader
    for (UniformFunctionsMap::iterator it= uniforms->functions.begin(); it != uniforms->functions.end(); ++it)
        if (it->second.present && it->second.print)
            mvwprintw(stt_win, y++, stt_x, "%23s  %s", it->first.c_str(), it->second.print().c_str() );

    for (UniformSequenceMap::iterator it= uniforms->sequences.begin(); it != uniforms->sequences.end(); ++it) {
        if (it->second.size() > 0) {
            size_t frame = uniforms->getFrame() % it->second.size();
            mvwprintw(stt_win, y++, stt_x, "%23s  %s", it->first.c_str(), it->second[frame].print().c_str() );
        }
    }

    for (vera::TexturesMap::iterator it = uniforms->textures.begin(); it != uniforms->textures.end(); ++it)
        mvwprintw(stt_win, y++, stt_x, "%23s  %.1f,%.1f", (it->first + "Resolution").c_str(), (float)it->second->getWidth(), (float)it->second->getHeight());

    for (vera::TextureStreamsMap::iterator it = uniforms->streams.begin(); it != uniforms->streams.end(); ++it) {
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"CurrentFrame").c_str(), it->second->getCurrentFrame() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"TotalFrames").c_str(), it->second->getTotalFrames() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Time").c_str(), it->second->getTime() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Duration").c_str(), it->second->getDuration() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Fps").c_str(), it->second->getFps() );
    }
    if (have_colors) wattroff(stt_win, COLOR_PAIR(1));

    if (have_colors) wattron(stt_win, COLOR_PAIR(2));
    uniforms_starts_at = y;
    int i = 0;
    for (UniformDataMap::iterator it= uniforms->data.begin(); it != uniforms->data.end(); ++it) {
        if (it->second.size > 4)
            continue;

        mvwprintw(stt_win, y, stt_x, "%23s", it->first.c_str());
        int cell_width = stt_x + (stt_width - stt_values_col) / it->second.size;

        if (i == mouse_at) {
            mouse_at_key = it->first.c_str();
            mouse_at_index = 0;
            
            if (mouse_x > stt_values_col + cell_width)
                mouse_at_index = (mouse_x - stt_values_col) / cell_width;
        }

        for (size_t j = 0 ; j < it->second.size && j < 4; j++) {
            if (i == mouse_at && j == mouse_at_index)
                if (have_colors) wattron(stt_win, COLOR_PAIR(2));
            mvwprintw(stt_win, y, stt_values_col + cell_width * j, "%.3f",it->second.value[j]);
            if (have_colors) wattroff(stt_win, COLOR_PAIR(2));
        }
        y++;
        i++;
    }
    if (have_colors) wattron(stt_win, COLOR_PAIR(2));

    // if (y > stt_win_height) {
    //     stt_win_height = y + 1;
    //     wresize(stt_win, stt_win_height, stt_width );
    //     mvwin(stt_win, 0, COLS - stt_width );
    // }

    wrefresh(stt_win);
    refresh_cursor();
}